

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cpp
# Opt level: O2

void __thiscall Hash_Collisions_Test::~Hash_Collisions_Test(Hash_Collisions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Hash, Collisions) {
    std::set<uint32_t> low, high;
    std::set<uint64_t> full;

    int lowCollisions = 0, highCollisions = 0;
    int fullCollisions = 0;
    int same = 0;
    for (int i = 0; i < 10000000; ++i) {
        uint64_t h = Hash(i);

        if (h == i)
            ++same;

        if (low.find(h) != low.end())
            ++lowCollisions;
        if (high.find(h >> 32) != high.end())
            ++highCollisions;
        if (full.find(h >> 32) != full.end())
            ++fullCollisions;
    }

    // It's actually potentially legit if any of these hit; it should
    // shouldn't happen a lot.
    EXPECT_EQ(0, same);
    EXPECT_EQ(0, lowCollisions);
    EXPECT_EQ(0, highCollisions);
    EXPECT_EQ(0, fullCollisions);
}